

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerSharedInputState.hpp
# Opt level: O0

void __thiscall antlr::LexerInputState::initialize(LexerInputState *this,istream *in,char *file)

{
  CharBuffer *this_00;
  char *in_RDX;
  long in_RDI;
  istream *in_stack_ffffffffffffffb8;
  
  *(undefined4 *)(in_RDI + 8) = 1;
  *(undefined4 *)(in_RDI + 0xc) = 1;
  *(undefined4 *)(in_RDI + 0x10) = 1;
  *(undefined4 *)(in_RDI + 0x14) = 1;
  *(undefined4 *)(in_RDI + 0x18) = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x20),in_RDX);
  if (((*(long *)(in_RDI + 0x40) != 0) && ((*(byte *)(in_RDI + 0x48) & 1) != 0)) &&
     (*(long **)(in_RDI + 0x40) != (long *)0x0)) {
    (**(code **)(**(long **)(in_RDI + 0x40) + 8))();
  }
  this_00 = (CharBuffer *)operator_new(0x40);
  CharBuffer::CharBuffer(this_00,in_stack_ffffffffffffffb8);
  *(CharBuffer **)(in_RDI + 0x40) = this_00;
  *(undefined1 *)(in_RDI + 0x48) = 1;
  return;
}

Assistant:

virtual void initialize( ANTLR_USE_NAMESPACE(std)istream& in, const char* file = "" )
	{
		column = 1;
		line = 1;
		tokenStartColumn = 1;
		tokenStartLine = 1;
		guessing = 0;
		filename = file;

		if( input && inputResponsible )
			delete input;

		input = new CharBuffer(in);
		inputResponsible = true;
	}